

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void reverse_iterator_suite::iterate_boolean(void)

{
  index_type *piVar1;
  bool bVar2;
  type tVar3;
  pointer this;
  reference lhs;
  pointer ptVar4;
  reference pbVar5;
  reverse_iterator local_198;
  bool local_179;
  reverse_iterator local_178;
  undefined1 local_160 [8];
  const_reverse_iterator where_2;
  variable data_2;
  bool local_f9;
  const_reverse_iterator local_f8;
  undefined1 local_e0 [8];
  const_reverse_iterator where_1;
  variable data_1;
  bool local_79;
  reverse_iterator local_78;
  undefined1 local_50 [8];
  reverse_iterator where;
  variable data;
  
  piVar1 = &where.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)piVar1,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((reverse_iterator *)local_50,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_78,
             (basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_50,&local_78);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9f4,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_78);
  this = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
         operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)local_50);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>(this);
  boost::detail::test_impl
            ("where->is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9f5,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  lhs = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
        operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                   *)local_50);
  local_79 = true;
  tVar3 = trial::dynamic::operator==(lhs,&local_79);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9f6,"void reverse_iterator_suite::iterate_boolean()",tVar3);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            ((reverse_iterator *)&data_1.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_50,
                          (reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)&data_1.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9f8,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)&data_1.storage.field_0x28);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_1.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)piVar1,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((const_reverse_iterator *)local_e0,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_f8,
             (basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_e0,&local_f8);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9fd,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_f8);
  ptVar4 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_e0);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>(ptVar4)
  ;
  boost::detail::test_impl
            ("where->is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9fe,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  pbVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_e0);
  local_f9 = true;
  tVar3 = trial::dynamic::operator==(pbVar5,&local_f9);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9ff,"void reverse_iterator_suite::iterate_boolean()",tVar3);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            ((const_reverse_iterator *)&data_2.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_e0,
                          (reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)&data_2.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa01,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)&data_2.storage.field_0x28);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_2.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)piVar1,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::crbegin
            ((const_reverse_iterator *)local_160,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_178,
             (basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_160,&local_178);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa06,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_178);
  ptVar4 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_160);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>(ptVar4)
  ;
  boost::detail::test_impl
            ("where->is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa07,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  pbVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_160);
  local_179 = true;
  tVar3 = trial::dynamic::operator==(pbVar5,&local_179);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa08,"void reverse_iterator_suite::iterate_boolean()",tVar3);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_198,
             (basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_160,&local_198);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa0a,"void reverse_iterator_suite::iterate_boolean()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_198);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void iterate_boolean()
{
    {
        variable data(true);
        variable::reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<boolean>());
        TRIAL_PROTOCOL_TEST(*where == true);
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        const variable data(true);
        variable::const_reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<boolean>());
        TRIAL_PROTOCOL_TEST(*where == true);
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        variable data(true);
        variable::const_reverse_iterator where = data.crbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<boolean>());
        TRIAL_PROTOCOL_TEST(*where == true);
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
}